

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

int64_t __thiscall spvtools::opt::analysis::IntConstant::GetS64BitValue(IntConstant *this)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])();
  if (((long *)CONCAT44(extraout_var,iVar2))[1] - *(long *)CONCAT44(extraout_var,iVar2) == 8) {
    iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    uVar1 = *(undefined4 *)(*(long *)CONCAT44(extraout_var_00,iVar2) + 4);
    iVar2 = (*(this->super_ScalarConstant).super_Constant._vptr_Constant[0x18])(this);
    return CONCAT44(uVar1,**(undefined4 **)CONCAT44(extraout_var_01,iVar2));
  }
  __assert_fail("words().size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.h"
                ,0xd2,"int64_t spvtools::opt::analysis::IntConstant::GetS64BitValue() const");
}

Assistant:

int64_t GetS64BitValue() const {
    // Relies on unsigned values smaller than 64-bit being sign extended.  See
    // section 2.2.1 of the SPIR-V spec.
    assert(words().size() == 2);
    return static_cast<uint64_t>(words()[1]) << 32 |
           static_cast<uint64_t>(words()[0]);
  }